

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testThreads.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  xmlThreadParams *__arg;
  long lVar3;
  int *piVar4;
  char *__s;
  ulong uVar5;
  void *result;
  
  xmlInitParser();
  iVar2 = 0;
  do {
    if (iVar2 == 500) {
      xmlCleanupParser();
      xmlMemoryDump();
      return 0;
    }
    xmlLoadCatalog();
    tid[0]._0_4_ = 0xffffffff;
    tid[0]._4_4_ = 0xffffffff;
    tid[1]._0_4_ = 0xffffffff;
    tid[1]._4_4_ = 0xffffffff;
    tid[6] = 0xffffffffffffffff;
    tid[2]._0_4_ = 0xffffffff;
    tid[2]._4_4_ = 0xffffffff;
    tid[3]._0_4_ = 0xffffffff;
    tid[3]._4_4_ = 0xffffffff;
    tid[4]._0_4_ = 0xffffffff;
    tid[4]._4_4_ = 0xffffffff;
    tid[5]._0_4_ = 0xffffffff;
    tid[5]._4_4_ = 0xffffffff;
    __arg = threadParams;
    lVar3 = 0;
    while (lVar3 + 8 != 0x40) {
      iVar1 = pthread_create((pthread_t *)((long)tid + lVar3),(pthread_attr_t *)0x0,
                             thread_specific_data,__arg);
      __arg = __arg + 1;
      lVar3 = lVar3 + 8;
      if (iVar1 != 0) {
        __s = "pthread_create";
        goto LAB_00101352;
      }
    }
    for (lVar3 = 0; lVar3 != 0x38; lVar3 = lVar3 + 8) {
      iVar1 = pthread_join(*(pthread_t *)((long)tid + lVar3),&result);
      if (iVar1 != 0) {
        __s = "pthread_join";
LAB_00101352:
        perror(__s);
        exit(1);
      }
    }
    xmlCatalogCleanup();
    piVar4 = &threadParams[0].okay;
    for (uVar5 = 0; uVar5 != 7; uVar5 = uVar5 + 1) {
      if (*piVar4 == 0) {
        printf("Thread %d handling %s failed\n",uVar5 & 0xffffffff,
               ((xmlThreadParams *)(piVar4 + -2))->filename);
      }
      piVar4 = piVar4 + 4;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int
main(void)
{
    unsigned int i, repeat;
    int ret;

    xmlInitParser();
    for (repeat = 0;repeat < TEST_REPEAT_COUNT;repeat++) {
	xmlLoadCatalog(catalog);

        memset(tid, 0xff, sizeof(*tid)*num_threads);

	for (i = 0; i < num_threads; i++) {
	    ret = pthread_create(&tid[i], NULL, thread_specific_data,
				 (void *) &threadParams[i]);
	    if (ret != 0) {
		perror("pthread_create");
		exit(1);
	    }
	}
	for (i = 0; i < num_threads; i++) {
            void *result;
	    ret = pthread_join(tid[i], &result);
	    if (ret != 0) {
		perror("pthread_join");
		exit(1);
	    }
	}

	xmlCatalogCleanup();
	for (i = 0; i < num_threads; i++)
	    if (threadParams[i].okay == 0)
		printf("Thread %d handling %s failed\n", i,
                       threadParams[i].filename);
    }
    xmlCleanupParser();
    xmlMemoryDump();
    return (0);
}